

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedGroup::init
          (ComputeShaderGeneratedGroup *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Context *pCVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  TestNode *node;
  long *plVar7;
  undefined8 *puVar8;
  long *extraout_RAX;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  long lVar12;
  string desc;
  string name;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  ulong *local_348;
  long local_340;
  ulong local_338;
  long lStack_330;
  ulong *local_328;
  long local_320;
  ulong local_318;
  long lStack_310;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  long lStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  TestNode *local_2a8;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  long local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ComputeShaderGeneratedGroup *local_1b8;
  TestNode *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"separate",
             "Use separate compute shaders for each buffer");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"combined",
             "Use combined compute shader for all buffers");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"large",
             "Draw shapes with large buffers");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  local_2a8 = pTVar6;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  local_1b0 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawarrays_compute_cmd",
             "Command from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 1;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000010;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawarrays_compute_data",
             "Data from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x100;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000010;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawarrays_compute_cmd_and_data",
             "Command and data from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x101;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000010;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_cmd",
             "Command from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 1;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_data",
             "Data from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x100;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_indices",
             "Indices from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 1;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_cmd_and_data",
             "Command and data from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x101;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_cmd_and_indices",
             "Command and indices from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 1;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 1;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_data_and_indices",
             "Data and indices from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x100;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 1;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_cmd_and_data_and_indices",
             "Command, data and indices from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x101;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 1;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawarrays_compute_cmd_and_data",
             "Command and data from compute shader");
  pTVar5 = local_2a8;
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x101;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000010;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedCombinedCase_02199ba8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(local_2a8,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_cmd_and_data",
             "Command and data from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x101;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedCombinedCase_02199ba8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_cmd_and_indices",
             "Command and indices from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 1;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 1;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedCombinedCase_02199ba8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_data_and_indices",
             "Data and indices from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x100;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 1;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedCombinedCase_02199ba8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_1b8 = this;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar4->m_testCtx,"drawelements_compute_cmd_and_data_and_indices",
             "Command, data and indices from compute shader");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  *(undefined2 *)((long)&pTVar6[1].m_testCtx + 4) = 0x101;
  *(undefined1 *)((long)&pTVar6[1].m_testCtx + 6) = 1;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x100000014;
  *(undefined4 *)&pTVar6[1].m_name._M_string_length = 8;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 0xc) = 0;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__ComputeShaderGeneratedCombinedCase_02199ba8;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  local_260 = 0;
  do {
    lVar12 = 0;
    do {
      local_258 = &local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,0x1b32ab9);
      local_2a8 = (TestNode *)CONCAT44(local_2a8._4_4_,init::methods[local_260].method);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_2a0 = &local_290;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_290 = *plVar9;
        lStack_288 = plVar7[3];
      }
      else {
        local_290 = *plVar9;
        local_2a0 = (long *)*plVar7;
      }
      local_298 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      bVar1 = init::methods[local_260].separateCompute;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      local_308 = &local_2f8;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_2f8 = *puVar10;
        lStack_2f0 = plVar7[3];
      }
      else {
        local_2f8 = *puVar10;
        local_308 = (ulong *)*plVar7;
      }
      local_300 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_308);
      local_388 = &local_378;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_378 = *puVar10;
        lStack_370 = plVar7[3];
      }
      else {
        local_378 = *puVar10;
        local_388 = (ulong *)*plVar7;
      }
      local_380 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      iVar2 = init::specs[lVar12].gridSize;
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if (local_388 != &local_378) {
        uVar11 = local_378;
      }
      if (uVar11 < (ulong)(local_2c0 + local_380)) {
        uVar11 = 0xf;
        if (local_2c8 != &local_2b8) {
          uVar11 = local_2b8;
        }
        if (uVar11 < (ulong)(local_2c0 + local_380)) goto LAB_013e7e7b;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_388);
      }
      else {
LAB_013e7e7b:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_2c8);
      }
      local_368 = &local_358;
      puVar10 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar10) {
        local_358 = *puVar10;
        lStack_350 = puVar8[3];
      }
      else {
        local_358 = *puVar10;
        local_368 = (ulong *)*puVar8;
      }
      local_360 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_368);
      local_348 = &local_338;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_338 = *puVar10;
        lStack_330 = plVar7[3];
      }
      else {
        local_338 = *puVar10;
        local_348 = (ulong *)*plVar7;
      }
      local_340 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if (local_348 != &local_338) {
        uVar11 = local_338;
      }
      if (uVar11 < (ulong)(local_2e0 + local_340)) {
        uVar11 = 0xf;
        if (local_2e8 != &local_2d8) {
          uVar11 = local_2d8;
        }
        if (uVar11 < (ulong)(local_2e0 + local_340)) goto LAB_013e7fd5;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_348);
      }
      else {
LAB_013e7fd5:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_2e8);
      }
      local_328 = &local_318;
      puVar10 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar10) {
        local_318 = *puVar10;
        lStack_310 = puVar8[3];
      }
      else {
        local_318 = *puVar10;
        local_328 = (ulong *)*puVar8;
      }
      local_320 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_328);
      local_3a8 = &local_398;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_398 = *puVar10;
        lStack_390 = plVar7[3];
      }
      else {
        local_398 = *puVar10;
        local_3a8 = (ulong *)*plVar7;
      }
      local_3a0 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      iVar3 = init::specs[lVar12].numDrawCommands;
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if (local_3a8 != &local_398) {
        uVar11 = local_398;
      }
      if (uVar11 < (ulong)(local_278 + local_3a0)) {
        uVar11 = 0xf;
        if (local_280 != local_270) {
          uVar11 = local_270[0];
        }
        if (uVar11 < (ulong)(local_278 + local_3a0)) goto LAB_013e814b;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_3a8);
      }
      else {
LAB_013e814b:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_280);
      }
      local_238 = &local_228;
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_228 = *plVar7;
        uStack_220 = puVar8[3];
      }
      else {
        local_228 = *plVar7;
        local_238 = (long *)*puVar8;
      }
      local_230 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)plVar7 = 0;
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398 + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,local_2d8 + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368,local_358 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_388 != &local_378) {
        operator_delete(local_388,local_378 + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      local_280 = local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Draw grid with ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_280);
      local_2e8 = &local_2d8;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_2d8 = *puVar10;
        lStack_2d0 = plVar7[3];
      }
      else {
        local_2d8 = *puVar10;
        local_2e8 = (ulong *)*plVar7;
      }
      local_2e0 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e8);
      local_2c8 = &local_2b8;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_2b8 = *puVar10;
        lStack_2b0 = plVar7[3];
      }
      else {
        local_2b8 = *puVar10;
        local_2c8 = (ulong *)*plVar7;
      }
      local_2c0 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_248 = *plVar9;
        lStack_240 = plVar7[3];
        local_258 = &local_248;
      }
      else {
        local_248 = *plVar9;
        local_258 = (long *)*plVar7;
      }
      local_250 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_2a0 = &local_290;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_290 = *plVar9;
        lStack_288 = plVar7[3];
      }
      else {
        local_290 = *plVar9;
        local_2a0 = (long *)*plVar7;
      }
      local_298 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      local_308 = &local_2f8;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_2f8 = *puVar10;
        lStack_2f0 = plVar7[3];
      }
      else {
        local_2f8 = *puVar10;
        local_308 = (ulong *)*plVar7;
      }
      local_300 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if (local_308 != &local_2f8) {
        uVar11 = local_2f8;
      }
      if (uVar11 < (ulong)(local_1d0 + local_300)) {
        uVar11 = 0xf;
        if (local_1d8 != local_1c8) {
          uVar11 = local_1c8[0];
        }
        if (uVar11 < (ulong)(local_1d0 + local_300)) goto LAB_013e861f;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_308);
      }
      else {
LAB_013e861f:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_1d8);
      }
      local_388 = &local_378;
      puVar10 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar10) {
        local_378 = *puVar10;
        lStack_370 = puVar8[3];
      }
      else {
        local_378 = *puVar10;
        local_388 = (ulong *)*puVar8;
      }
      local_380 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
      local_368 = &local_358;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_358 = *puVar10;
        lStack_350 = plVar7[3];
      }
      else {
        local_358 = *puVar10;
        local_368 = (ulong *)*plVar7;
      }
      local_360 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if (local_368 != &local_358) {
        uVar11 = local_358;
      }
      if (uVar11 < (ulong)(local_1f0 + local_360)) {
        uVar11 = 0xf;
        if (local_1f8 != local_1e8) {
          uVar11 = local_1e8[0];
        }
        if (uVar11 < (ulong)(local_1f0 + local_360)) goto LAB_013e877c;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_368);
      }
      else {
LAB_013e877c:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_1f8);
      }
      local_348 = &local_338;
      puVar10 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar10) {
        local_338 = *puVar10;
        lStack_330 = puVar8[3];
      }
      else {
        local_338 = *puVar10;
        local_348 = (ulong *)*puVar8;
      }
      local_340 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_328 = &local_318;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_318 = *puVar10;
        lStack_310 = plVar7[3];
      }
      else {
        local_318 = *puVar10;
        local_328 = (ulong *)*plVar7;
      }
      local_320 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if (local_328 != &local_318) {
        uVar11 = local_318;
      }
      if (uVar11 < (ulong)(local_210 + local_320)) {
        uVar11 = 0xf;
        if (local_218 != local_208) {
          uVar11 = local_208[0];
        }
        if (uVar11 < (ulong)(local_210 + local_320)) goto LAB_013e88f2;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_328);
      }
      else {
LAB_013e88f2:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_218);
      }
      local_3a8 = &local_398;
      puVar10 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar10) {
        local_398 = *puVar10;
        lStack_390 = puVar8[3];
      }
      else {
        local_398 = *puVar10;
        local_3a8 = (ulong *)*puVar8;
      }
      local_3a0 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      if (local_218 != local_208) {
        operator_delete(local_218,local_208[0] + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368,local_358 + 1);
      }
      if (local_388 != &local_378) {
        operator_delete(local_388,local_378 + 1);
      }
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,local_2d8 + 1);
      }
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      if (bVar1 == false) {
        pTVar5 = (TestNode *)operator_new(0xa8);
        pCVar4 = (local_1b8->super_TestCaseGroup).m_context;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,(char *)local_238,(char *)local_3a8);
        ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
        *(int *)&pTVar5[1].m_testCtx = (int)local_2a8;
        *(undefined2 *)((long)&pTVar5[1].m_testCtx + 4) = 0x100;
        *(bool *)((long)&pTVar5[1].m_testCtx + 6) = (int)local_2a8 == 1;
        *(uint *)&pTVar5[1].m_name._M_dataplus._M_p = (uint)((int)local_2a8 != 0) * 4 + 0x10;
        *(int *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = iVar3;
        *(int *)&pTVar5[1].m_name._M_string_length = iVar2;
        *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0;
        *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 0xc) = 0;
        ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode =
             (_func_int **)&PTR__ComputeShaderGeneratedCombinedCase_02199ba8;
        pTVar5[1].m_description._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pTVar5 = (TestNode *)operator_new(0xb8);
        pCVar4 = (local_1b8->super_TestCaseGroup).m_context;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,(char *)local_238,(char *)local_3a8);
        ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
        *(int *)&pTVar5[1].m_testCtx = (int)local_2a8;
        *(undefined2 *)((long)&pTVar5[1].m_testCtx + 4) = 0x100;
        *(bool *)((long)&pTVar5[1].m_testCtx + 6) = (int)local_2a8 == 1;
        *(uint *)&pTVar5[1].m_name._M_dataplus._M_p = (uint)((int)local_2a8 != 0) * 4 + 0x10;
        *(int *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = iVar3;
        *(int *)&pTVar5[1].m_name._M_string_length = iVar2;
        *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0;
        *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 0xc) = 0;
        ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode =
             (_func_int **)&PTR__ComputeShaderGeneratedSeparateCase_02199af8;
        pTVar5[1].m_description._M_dataplus._M_p = (pointer)0x0;
        pTVar5[1].m_description._M_string_length = 0;
        pTVar5[1].m_description.field_2._M_allocated_capacity = 0;
      }
      tcu::TestNode::addChild(local_1b0,pTVar5);
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398 + 1);
      }
      plVar7 = &local_228;
      if (local_238 != plVar7) {
        operator_delete(local_238,local_228 + 1);
        plVar7 = extraout_RAX;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x10);
    local_260 = local_260 + 1;
    if (local_260 == 4) {
      return (int)plVar7;
    }
  } while( true );
}

Assistant:

void ComputeShaderGeneratedGroup::init (void)
{
	const int					gridSize		= 8;
	tcu::TestCaseGroup* const	separateGroup	= new tcu::TestCaseGroup(m_testCtx, "separate", "Use separate compute shaders for each buffer");
	tcu::TestCaseGroup* const	combinedGroup	= new tcu::TestCaseGroup(m_testCtx, "combined", "Use combined compute shader for all buffers");
	tcu::TestCaseGroup* const	largeGroup		= new tcu::TestCaseGroup(m_testCtx, "large",   "Draw shapes with large buffers");

	this->addChild(separateGroup);
	this->addChild(combinedGroup);
	this->addChild(largeGroup);

	// .separate
	{
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_cmd",							"Command from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	false,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_data",						"Data from compute shader",							ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		false,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	true,	false,	gridSize,	1));

		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd",						"Command from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_data",						"Data from compute shader",							ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_indices",					"Indices from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	false,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_indices",			"Command and indices from compute shader",			ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_data_and_indices",			"Data and indices from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_data_and_indices",	"Command, data and indices from compute shader",	ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	true,	gridSize,	1));
	}

	// .combined
	{
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawarrays_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	true,	false,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	false,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_indices",			"Command and indices from compute shader",			ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	true,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_data_and_indices",			"Data and indices from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	true,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_data_and_indices",	"Command, data and indices from compute shader",	ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	true,	gridSize,	1));
	}

	// .large
	{
		struct TestSpec
		{
			int gridSize;
			int numDrawCommands;
		};
		struct TestMethod
		{
			ComputeShaderGeneratedCase::DrawMethod method;
			bool                                   separateCompute;
		};

		static const TestSpec specs[] =
		{
			{ 100,	1 },		// !< drawArrays array size ~ 1.9 MB
			{ 200,	1 },		// !< drawArrays array size ~ 7.7 MB
			{ 500,	1 },		// !< drawArrays array size ~ 48 MB
			{ 1000,	1 },		// !< drawArrays array size ~ 192 MB
			{ 1200,	1 },		// !< drawArrays array size ~ 277 MB
			{ 1500,	1 },		// !< drawArrays array size ~ 430 MB

			{ 100,	8 },		// !< drawArrays array size ~ 1.9 MB
			{ 200,	8 },		// !< drawArrays array size ~ 7.7 MB
			{ 500,	8 },		// !< drawArrays array size ~ 48 MB
			{ 1000,	8 },		// !< drawArrays array size ~ 192 MB
			{ 1200,	8 },		// !< drawArrays array size ~ 277 MB
			{ 1500,	8 },		// !< drawArrays array size ~ 430 MB

			{ 100,	200  },		// !< 50 cells per draw call
			{ 200,	800  },		// !< 50 cells per draw call
			{ 500,	2500 },		// !< 100 cells per draw call
			{ 1000,	5000 },		// !< 250 cells per draw call
		};
		static const TestMethod methods[] =
		{
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,	true	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,	false	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false	},
		};

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(methods); ++methodNdx)
		for (int specNdx = 0; specNdx < DE_LENGTH_OF_ARRAY(specs); ++specNdx)
		{
			const std::string name = std::string("")
									+ ((methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS) ? ("drawarrays") : ("drawelements"))
									+ ((methods[methodNdx].separateCompute) ? ("_separate") : ("_combined"))
									+ "_grid_" + de::toString(specs[specNdx].gridSize) + "x" + de::toString(specs[specNdx].gridSize)
									+ "_drawcount_" + de::toString(specs[specNdx].numDrawCommands);

			const std::string desc = std::string("Draw grid with ")
									+ ((methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS) ? ("drawarrays indirect") : ("drawelements indirect"))
									+ " calculating buffers in " + ((methods[methodNdx].separateCompute) ? ("separate") : ("combined")) + " compute shader."
									+ " Grid size is " + de::toString(specs[specNdx].gridSize) + "x" + de::toString(specs[specNdx].gridSize)
									+ ", draw count is "  + de::toString(specs[specNdx].numDrawCommands);

			const bool computeIndices = (methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS);

			if (methods[methodNdx].separateCompute)
				largeGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, name.c_str(), desc.c_str(), methods[methodNdx].method, false, true, computeIndices, specs[specNdx].gridSize, specs[specNdx].numDrawCommands));
			else
				largeGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, name.c_str(), desc.c_str(), methods[methodNdx].method, false, true, computeIndices, specs[specNdx].gridSize, specs[specNdx].numDrawCommands));
		}
	}
}